

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_midi.c
# Opt level: O1

void pgmin_list(t_pgmin *x,t_symbol *s,int argc,t_atom *argv)

{
  float fVar1;
  t_float f;
  t_float f_00;
  
  f = atom_getfloatarg(0,argc,argv);
  f_00 = atom_getfloatarg(1,argc,argv);
  fVar1 = x->x_channel;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    if ((f_00 != fVar1) || (NAN(f_00) || NAN(fVar1))) {
      return;
    }
  }
  else {
    outlet_float(x->x_outlet2,f_00);
  }
  outlet_float(x->x_outlet1,f);
  return;
}

Assistant:

static void pgmin_list(t_pgmin *x, t_symbol *s, int argc, t_atom *argv)
{
    t_float value = atom_getfloatarg(0, argc, argv);
    t_float channel = atom_getfloatarg(1, argc, argv);
    if (x->x_channel != 0)
    {
        if (channel != x->x_channel) return;
        outlet_float(x->x_outlet1, value);
    }
    else
    {
        outlet_float(x->x_outlet2, channel);
        outlet_float(x->x_outlet1, value);
    }
}